

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor * ggml_conv_transpose_2d_p0(ggml_context *ctx,ggml_tensor *a,ggml_tensor *b,int stride)

{
  ggml_tensor *tensor;
  int in_ECX;
  ggml_tensor *in_RDX;
  ggml_tensor *in_RSI;
  ggml_tensor *result;
  int64_t ne [4];
  int in_stack_ffffffffffffffa8;
  ggml_type in_stack_ffffffffffffffac;
  ggml_context *in_stack_ffffffffffffffb0;
  
  if (in_RSI->ne[3] != in_RDX->ne[2]) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml.c"
               ,0x1011,"GGML_ASSERT(%s) failed","a->ne[3] == b->ne[2]");
  }
  ggml_calc_conv_transpose_output_size(in_RDX->ne[0],in_RSI->ne[0],in_ECX,0);
  ggml_calc_conv_transpose_output_size(in_RDX->ne[1],in_RSI->ne[1],in_ECX,0);
  tensor = ggml_new_tensor(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                           in_stack_ffffffffffffffa8,(int64_t *)0x151062);
  ggml_set_op_params_i32(tensor,0,in_ECX);
  tensor->op = GGML_OP_CONV_TRANSPOSE_2D;
  tensor->src[0] = in_RSI;
  tensor->src[1] = in_RDX;
  return tensor;
}

Assistant:

struct ggml_tensor * ggml_conv_transpose_2d_p0(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor  * b,
        int                   stride) {
    GGML_ASSERT(a->ne[3] == b->ne[2]);

    const int64_t ne[4] = {
        ggml_calc_conv_transpose_output_size(b->ne[0], a->ne[0], stride, 0 /*p0*/),
        ggml_calc_conv_transpose_output_size(b->ne[1], a->ne[1], stride, 0 /*p1*/),
        a->ne[2], b->ne[3],
    };

    struct ggml_tensor* result = ggml_new_tensor(ctx, GGML_TYPE_F32, 4, ne);

    ggml_set_op_params_i32(result, 0, stride);

    result->op     = GGML_OP_CONV_TRANSPOSE_2D;
    result->src[0] = a;
    result->src[1] = b;

    return result;
}